

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_solve_internal(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  float fVar2;
  uint uVar3;
  clause cVar4;
  double *pdVar5;
  xdbl xVar6;
  int *piVar7;
  word *pwVar8;
  lit *plVar9;
  veci *v;
  uint uVar10;
  int v_00;
  uint uVar11;
  abctime aVar12;
  word wVar13;
  xdbl xVar14;
  xdbl xVar15;
  ulong uVar16;
  clause *pcVar17;
  int *piVar18;
  int iVar19;
  uint *puVar20;
  int iVar21;
  int tag;
  int tag_00;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  char cVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  uint k;
  double dVar28;
  double dVar29;
  veci local_a8;
  int local_94;
  veci *local_90;
  int local_88;
  int local_84;
  long local_80;
  uint *local_78;
  double *local_70;
  long local_68;
  double local_60;
  Sat_Mem_t *local_58;
  veci *local_50;
  int *local_48;
  long local_40;
  veci *local_38;
  
  local_50 = &s->unit_lits;
  veci_resize(local_50,0);
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    puts("==================================[MINISAT]===================================");
    puts("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |");
    puts("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |");
    puts("==============================================================================");
  }
  local_48 = &s->root_level;
  local_58 = &s->Mem;
  local_90 = &s->stack;
  local_38 = &s->order;
  local_70 = &s->random_seed;
  local_94 = 0;
  cVar22 = '\0';
LAB_00726724:
  if (cVar22 == '\0') {
    uVar10 = (s->stats).learnts;
    if (uVar10 == 0) {
      dVar29 = 0.0;
    }
    else {
      dVar29 = (double)(s->stats).learnts_literals / (double)uVar10;
    }
    if ((s->nRuntimeLimit == 0) || (aVar12 = Abc_Clock(), aVar12 <= s->nRuntimeLimit)) {
      if (0 < s->verbosity) {
        printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
               (double)(s->stats).conflicts,(double)(s->stats).clauses,
               (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
               (double)(s->stats).learnts_literals,dVar29,s->progress_estimate * 100.0);
        fflush(_stdout);
      }
      iVar25 = 0;
      for (iVar19 = 1; iVar21 = local_94, iVar19 <= local_94; iVar19 = iVar19 * 2 + 1) {
        iVar25 = iVar25 + 1;
      }
      for (; iVar19 + -1 != iVar21; iVar21 = iVar21 % iVar19) {
        iVar19 = iVar19 + -1 >> 1;
        iVar25 = iVar25 + -1;
      }
      dVar29 = ldexp(1.0,iVar25);
      if (s->root_level != (s->trail_lim).size) {
        __assert_fail("s->root_level == sat_solver3_dl(s)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                      ,0x6f4,"lbool sat_solver3_search(sat_solver3 *, ABC_INT64_T)");
      }
      iVar19 = s->fNotUseRandom;
      uVar10 = s->nRestarts;
      s->nRestarts = uVar10 + 1;
      (s->stats).starts = (s->stats).starts + 1;
      local_a8.cap = 4;
      local_a8.size = 0;
      local_a8.ptr = (int *)malloc(0x10);
      if (((uVar10 & 1) == 0) && (iVar25 = (s->act_vars).size, 0 < iVar25)) {
        for (lVar26 = 0; lVar26 < iVar25; lVar26 = lVar26 + 1) {
          pdVar5 = s->factors;
          if (pdVar5 != (double *)0x0) {
            iVar25 = (s->act_vars).ptr[lVar26];
            iVar21 = s->VarActType;
            if (iVar21 == 2) {
              xVar15 = s->var_inc;
              xVar6 = s->activity[iVar25];
              xVar14 = Xdbl_FromDouble(pdVar5[iVar25]);
              xVar15 = Xdbl_Mul(xVar15,xVar14);
              xVar15 = Xdbl_Add(xVar6,xVar15);
              s->activity[iVar25] = xVar15;
              if (0x14c924d692ca61b < xVar15) goto LAB_0072691b;
            }
            else if (iVar21 == 1) {
              dVar28 = (double)s->var_inc * pdVar5[iVar25] + (double)s->activity[iVar25];
              s->activity[iVar25] = (word)dVar28;
              if (1e+100 < dVar28) goto LAB_0072691b;
            }
            else {
              if (iVar21 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                              ,0x184,"void act_var_bump_factor(sat_solver3 *, int)");
              }
              wVar13 = (long)(int)((float)pdVar5[iVar25] * (float)(uint)s->var_inc) +
                       s->activity[iVar25];
              s->activity[iVar25] = wVar13;
              if ((int)wVar13 < 0) {
LAB_0072691b:
                act_var_rescale(s);
              }
            }
            if (s->orderpos[iVar25] != -1) {
              order_update(s,iVar25);
            }
          }
          iVar25 = (s->act_vars).size;
        }
      }
      if ((s->pGlobalVars != (int *)0x0) && (iVar25 = (s->act_vars).size, 0 < iVar25)) {
        for (lVar26 = 0; lVar26 < iVar25; lVar26 = lVar26 + 1) {
          if (s->pGlobalVars != (int *)0x0) {
            iVar25 = (s->act_vars).ptr[lVar26];
            if (s->pGlobalVars[iVar25] != 0) {
              iVar21 = s->VarActType;
              if (iVar21 == 2) {
                xVar15 = s->var_inc;
                xVar6 = s->activity[iVar25];
                xVar14 = Xdbl_FromDouble(3.0);
                xVar15 = Xdbl_Mul(xVar15,xVar14);
                xVar15 = Xdbl_Add(xVar6,xVar15);
                s->activity[iVar25] = xVar15;
                if (0x14c924d692ca61b < xVar15) goto LAB_00726a54;
              }
              else if (iVar21 == 1) {
                dVar28 = (double)s->var_inc * 3.0 + (double)s->activity[iVar25];
                s->activity[iVar25] = (word)dVar28;
                if (1e+100 < dVar28) goto LAB_00726a54;
              }
              else {
                if (iVar21 != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                                ,0x165,"void act_var_bump_global(sat_solver3 *, int)");
                }
                wVar13 = ((long)(s->var_inc * 0x300000000) >> 0x20) + s->activity[iVar25];
                s->activity[iVar25] = wVar13;
                if ((int)wVar13 < 0) {
LAB_00726a54:
                  act_var_rescale(s);
                }
              }
              if (s->orderpos[iVar25] != -1) {
                order_update(s,iVar25);
              }
            }
          }
          iVar25 = (s->act_vars).size;
        }
      }
      local_60 = 0.019999999552965164;
      if (iVar19 != 0) {
        local_60 = 0.0;
      }
      local_94 = local_94 + 1;
      local_40 = (long)(dVar29 * 100.0);
      local_68 = 0;
      do {
        while (uVar10 = sat_solver3_propagate(s), uVar10 != 0) {
          pAVar1 = &(s->stats).conflicts;
          *pAVar1 = *pAVar1 + 1;
          if ((s->trail_lim).size == s->root_level) {
            sat_solver3_analyze_final(s,uVar10,0);
            cVar22 = -1;
            goto LAB_00727361;
          }
          local_68 = local_68 + 1;
          iVar19 = 0;
          veci_resize(&local_a8,0);
          plVar9 = s->trail;
          iVar25 = s->qtail + -1;
          uVar11 = 0xfffffffe;
          veci_push(&local_a8,-2);
          lVar26 = extraout_RDX;
          do {
            if (uVar10 == 0) {
              __assert_fail("h != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                            ,0x37c,"void sat_solver3_analyze(sat_solver3 *, int, veci *)");
            }
            iVar21 = iVar19;
            if ((uVar10 & 1) == 0) {
              pcVar17 = Sat_MemClauseHand(local_58,uVar10);
              uVar16 = extraout_RDX_00;
              if (((uint)*pcVar17 & 1) != 0) {
                piVar7 = (s->act_clas).ptr;
                cVar4 = pcVar17[(ulong)((uint)*pcVar17 >> 0xb) + 1];
                uVar16 = (ulong)s->cla_inc;
                if (s->ClaActType == 0) {
                  piVar18 = piVar7 + (int)cVar4;
                  *piVar18 = *piVar18 + s->cla_inc;
                  if (*piVar18 < 0) {
                    if (s->ClaActType != 0) goto LAB_00726e59;
                    for (lVar26 = 0; uVar16 = (ulong)(s->act_clas).size, lVar26 < (long)uVar16;
                        lVar26 = lVar26 + 1) {
                      piVar7[lVar26] = (uint)piVar7[lVar26] >> 0xe;
                    }
                    uVar10 = s->cla_inc >> 0xe;
                    if (uVar10 < 0x401) {
                      uVar10 = 0x400;
                    }
                    goto LAB_00726e9f;
                  }
                }
                else {
                  fVar2 = (float)piVar7[(int)cVar4];
                  piVar7[(int)cVar4] = (int)((float)uVar16 + fVar2);
                  if (1e+20 < (float)uVar16 + fVar2) {
LAB_00726e59:
                    uVar10 = (s->act_clas).size;
                    uVar27 = (ulong)uVar10;
                    if ((int)uVar10 < 1) {
                      uVar27 = 0;
                    }
                    for (uVar16 = 0; uVar27 != uVar16; uVar16 = uVar16 + 1) {
                      piVar7[uVar16] = (int)((float)piVar7[uVar16] * 1e-20);
                    }
                    uVar10 = (uint)(long)((float)s->cla_inc * 1e-20);
LAB_00726e9f:
                    s->cla_inc = uVar10;
                  }
                }
              }
              for (uVar27 = (ulong)(uVar11 != 0xfffffffe); uVar27 < (uint)*pcVar17 >> 0xb;
                  uVar27 = uVar27 + 1) {
                iVar19 = (int)pcVar17[uVar27 + 1] >> 1;
                if ((s->tags[iVar19] == '\0') && (0 < s->levels[iVar19])) {
                  var_set_tag(s,iVar19,(int)uVar16);
                  act_var_bump(s,iVar19);
                  if (s->levels[iVar19] == (s->trail_lim).size) {
                    iVar21 = iVar21 + 1;
                    uVar16 = extraout_RDX_01;
                  }
                  else {
                    veci_push(&local_a8,(int)pcVar17[uVar27 + 1]);
                    uVar16 = extraout_RDX_02;
                  }
                }
              }
            }
            else {
              v_00 = (int)uVar10 >> 2;
              if ((s->tags[v_00] == '\0') && (0 < s->levels[v_00])) {
                var_set_tag(s,v_00,(int)lVar26);
                act_var_bump(s,v_00);
                if (s->levels[v_00] == (s->trail_lim).size) {
                  iVar21 = iVar19 + 1;
                }
                else {
                  veci_push(&local_a8,(int)uVar10 >> 1);
                }
              }
            }
            puVar20 = (uint *)(plVar9 + iVar25);
            do {
              uVar11 = *puVar20;
              lVar26 = (long)((int)uVar11 >> 1);
              puVar20 = puVar20 + -1;
              iVar25 = iVar25 + -1;
            } while (s->tags[lVar26] == '\0');
            uVar10 = s->reasons[lVar26];
            iVar19 = iVar21 + -1;
          } while (1 < iVar21);
          *local_a8.ptr = uVar11 ^ 1;
          lVar23 = (long)local_a8.size;
          uVar10 = 0;
          for (lVar26 = 1; lVar26 < lVar23; lVar26 = lVar26 + 1) {
            uVar10 = uVar10 | 1 << (*(byte *)(s->levels + (local_a8.ptr[lVar26] >> 1)) & 0x1f);
          }
          local_78 = (uint *)local_a8.ptr;
          puVar20 = (uint *)local_a8.ptr;
          local_80 = lVar23;
          iVar19 = 1;
          for (lVar26 = 1; v = local_90, lVar26 < lVar23; lVar26 = lVar26 + 1) {
            uVar11 = puVar20[lVar26];
            local_88 = iVar19;
            if (s->reasons[(int)uVar11 >> 1] == 0) {
LAB_0072717c:
              puVar20[iVar19] = uVar11;
              iVar21 = iVar19 + 1;
            }
            else {
              local_84 = (s->tagged).size;
              veci_resize(local_90,0);
              veci_push(v,(int)uVar11 >> 1);
              while( true ) {
                iVar25 = (s->stack).size;
                lVar23 = local_80;
                puVar20 = local_78;
                iVar21 = local_88;
                if ((long)iVar25 == 0) break;
                piVar7 = s->reasons;
                (s->stack).size = iVar25 + -1;
                uVar11 = piVar7[(s->stack).ptr[(long)iVar25 + -1]];
                if (uVar11 == 0) {
                  __assert_fail("s->reasons[v] != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                                ,0x2ef,"int sat_solver3_lit_removable(sat_solver3 *, int, int)");
                }
                if ((uVar11 & 1) == 0) {
                  pcVar17 = Sat_MemClauseHand(local_58,uVar11);
                  for (uVar16 = 1; uVar16 < (uint)*pcVar17 >> 0xb; uVar16 = uVar16 + 1) {
                    iVar25 = (int)pcVar17[uVar16 + 1] >> 1;
                    if ((s->tags[iVar25] == '\0') && (s->levels[iVar25] != 0)) {
                      if ((s->reasons[iVar25] == 0) ||
                         ((uVar10 >> (s->levels[iVar25] & 0x1fU) & 1) == 0)) goto LAB_0072715d;
                      veci_push(local_90,iVar25);
                      var_set_tag(s,iVar25,tag);
                    }
                  }
                }
                else {
                  iVar25 = (int)uVar11 >> 2;
                  if ((s->tags[iVar25] == '\0') && (s->levels[iVar25] != 0)) {
                    if ((piVar7[iVar25] == 0) || ((uVar10 >> (s->levels[iVar25] & 0x1fU) & 1) == 0))
                    {
LAB_0072715d:
                      solver2_clear_tags(s,local_84);
                      uVar11 = local_78[lVar26];
                      lVar23 = local_80;
                      puVar20 = local_78;
                      goto LAB_0072717c;
                    }
                    veci_push(local_90,iVar25);
                    var_set_tag(s,iVar25,tag_00);
                  }
                }
              }
            }
            iVar19 = iVar21;
          }
          veci_resize(&local_a8,iVar19);
          pAVar1 = &(s->stats).tot_literals;
          *pAVar1 = *pAVar1 + (long)iVar19;
          solver2_clear_tags(s,0);
          piVar7 = local_a8.ptr;
          iVar19 = local_a8.size;
          uVar16 = (ulong)local_a8.size;
          piVar18 = local_48;
          if (1 < (long)uVar16) {
            uVar10 = puVar20[1];
            piVar18 = s->levels;
            iVar25 = piVar18[(int)uVar10 >> 1];
            uVar24 = 1;
            for (uVar27 = 2; uVar16 != uVar27; uVar27 = uVar27 + 1) {
              iVar21 = piVar18[(int)puVar20[uVar27] >> 1];
              if (iVar25 < iVar21) {
                uVar24 = uVar27;
              }
              uVar24 = uVar24 & 0xffffffff;
              if (iVar25 < iVar21) {
                iVar25 = iVar21;
              }
            }
            puVar20[1] = puVar20[(int)uVar24];
            puVar20[(int)uVar24] = uVar10;
            piVar18 = piVar18 + (local_a8.ptr[1] >> 1);
          }
          iVar25 = *piVar18;
          if (*piVar18 < s->root_level) {
            iVar25 = s->root_level;
          }
          sat_solver3_canceluntil(s,iVar25);
          iVar25 = 0;
          if (1 < iVar19) {
            iVar25 = sat_solver3_clause_new(s,piVar7,piVar7 + uVar16,1);
          }
          sat_solver3_enqueue(s,*piVar7,iVar25);
          if (iVar19 < 1) {
            __assert_fail("veci_size(cls) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                          ,0x2bf,"void sat_solver3_record(sat_solver3 *, veci *)");
          }
          if (iVar25 == 0) {
            veci_push(local_50,*piVar7);
          }
          if (iVar19 == 1) {
            s->levels[*piVar7 >> 1] = 0;
          }
          iVar19 = s->VarActType;
          if (iVar19 == 2) {
            xVar15 = Xdbl_Mul(s->var_inc,s->var_decay);
            s->var_inc = xVar15;
          }
          else if (iVar19 == 1) {
            s->var_inc = (word)((double)s->var_inc * (double)s->var_decay);
          }
          else {
            if (iVar19 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                            ,399,"void act_var_decay(sat_solver3 *)");
            }
            s->var_inc = (s->var_inc >> 4) + s->var_inc;
          }
          if (s->ClaActType == 0) {
            uVar10 = (s->cla_inc >> 10) + s->cla_inc;
          }
          else {
            uVar10 = s->cla_inc * s->cla_decay;
          }
          s->cla_inc = uVar10;
        }
        if ((((-1 < local_40 && local_40 <= local_68) && s->fNoRestarts == 0) ||
            ((((s->nRuntimeLimit != 0 && (((s->stats).conflicts & 0x3f) == 0)) &&
              (aVar12 = Abc_Clock(), s->nRuntimeLimit < aVar12)) ||
             ((s->nConfLimit != 0 && (s->nConfLimit < (s->stats).conflicts)))))) ||
           ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) {
          dVar29 = sat_solver3_progress(s);
          s->progress_estimate = dVar29;
          sat_solver3_canceluntil(s,s->root_level);
          cVar22 = '\0';
          goto LAB_00727361;
        }
        if (((s->trail_lim).size == 0) && (s->fSkipSimplify == 0)) {
          sat_solver3_simplify(s);
        }
        if ((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) {
          sat_solver3_reducedb(s);
        }
        pAVar1 = &(s->stats).decisions;
        *pAVar1 = *pAVar1 + 1;
        piVar7 = s->orderpos;
        puVar20 = (uint *)(s->order).ptr;
        dVar29 = drand(local_70);
        if (local_60 <= dVar29) {
LAB_00726c3a:
          do {
            iVar19 = (s->order).size;
            if (iVar19 < 1) goto LAB_00727320;
            uVar10 = *puVar20;
            k = iVar19 - 1;
            uVar11 = puVar20[k];
            veci_resize(local_38,k);
            uVar16 = (ulong)(int)uVar10;
            piVar7[uVar16] = -1;
            if (iVar19 != 1) {
              iVar19 = 1;
              iVar25 = 0;
              while (iVar19 < (int)k) {
                iVar21 = iVar19 + 1;
                pwVar8 = s->activity;
                if (((int)k <= iVar21) ||
                   (pwVar8[(int)puVar20[iVar21]] <= pwVar8[(int)puVar20[iVar19]])) {
                  iVar21 = iVar19;
                }
                uVar3 = puVar20[iVar21];
                if (pwVar8[(int)uVar3] <= pwVar8[(int)uVar11]) break;
                puVar20[iVar25] = uVar3;
                piVar7[(int)uVar3] = iVar25;
                iVar25 = iVar21;
                iVar19 = iVar21 * 2 + 1;
              }
              puVar20[iVar25] = uVar11;
              piVar7[(int)uVar11] = iVar25;
            }
          } while (s->assigns[uVar16] != '\x03');
          if (uVar10 == 0xffffffff) goto LAB_00727320;
        }
        else {
          iVar19 = s->size;
          dVar29 = drand(local_70);
          uVar10 = (uint)(dVar29 * (double)iVar19);
          if (((int)uVar10 < 0) || (s->size <= (int)uVar10)) {
            __assert_fail("next >= 0 && next < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                          ,0xb4,"int order_select(sat_solver3 *, float)");
          }
          uVar16 = (ulong)uVar10;
          if (s->assigns[uVar16] != '\x03') goto LAB_00726c3a;
        }
        uVar10 = uVar10 * 2;
        if (s->polarity[uVar16] == '\0') {
          uVar10 = uVar10 | 1;
        }
        sat_solver3_decision(s,uVar10);
      } while( true );
    }
    cVar22 = '\0';
  }
LAB_007273ef:
  if (0 < s->verbosity) {
    puts("==============================================================================");
  }
  sat_solver3_canceluntil(s,s->root_level);
  return (int)cVar22;
LAB_00727320:
  for (lVar26 = 0; lVar26 < s->size; lVar26 = lVar26 + 1) {
    s->model[lVar26] = -(uint)(s->assigns[lVar26] != '\0') | 1;
  }
  sat_solver3_canceluntil(s,s->root_level);
  cVar22 = '\x01';
LAB_00727361:
  veci_delete(&local_a8);
  if ((((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
      ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) ||
     ((s->nRuntimeLimit != 0 && (aVar12 = Abc_Clock(), s->nRuntimeLimit < aVar12))))
  goto LAB_007273ef;
  goto LAB_00726724;
}

Assistant:

int sat_solver3_solve_internal(sat_solver3* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver3_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver3_canceluntil(s,s->root_level);
    return status;
}